

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjExporter::WriteHeader(ObjExporter *this,ostringstream *out)

{
  ostream *poVar1;
  char local_1a [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,
             "# File produced by Open Asset Import Library (http://www.assimp.sf.net)",0x47);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"# (assimp v",0xb);
  aiGetVersionMajor();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  local_1a[0] = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a,1);
  aiGetVersionMinor();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_1a[1] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a + 1,1);
  aiGetVersionRevision();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  return;
}

Assistant:

void ObjExporter::WriteHeader(std::ostringstream& out) {
    out << "# File produced by Open Asset Import Library (http://www.assimp.sf.net)" << endl;
    out << "# (assimp v" << aiGetVersionMajor() << '.' << aiGetVersionMinor() << '.'
        << aiGetVersionRevision() << ")" << endl  << endl;
}